

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O2

void * ResponseHandleRun(void *args)

{
  int iVar1;
  byte bVar2;
  int __fd;
  ssize_t sVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  char *pcVar6;
  _Self __tmp;
  socklen_t len_client;
  sockaddr_in addr_client;
  char write_buf [4096];
  char buf [4096];
  
  memset(buf,0,0x1000);
  len_client = 0x10;
  addr_client.sin_family = 0;
  addr_client.sin_port = 0;
  addr_client.sin_addr.s_addr = 0;
  addr_client.sin_zero[0] = '\0';
  addr_client.sin_zero[1] = '\0';
  addr_client.sin_zero[2] = '\0';
  addr_client.sin_zero[3] = '\0';
  addr_client.sin_zero[4] = '\0';
  addr_client.sin_zero[5] = '\0';
  addr_client.sin_zero[6] = '\0';
  addr_client.sin_zero[7] = '\0';
  __fd = accept(*(int *)((long)args + 0x10),(sockaddr *)&addr_client,&len_client);
  http_parser_init_(*(undefined8 *)((long)args + 0x178),0);
  *(void **)(*(long *)((long)args + 0x178) + 0x18) = args;
  while (sVar3 = recv(__fd,buf,0x1000,0), 0 < (int)sVar3) {
    http_parser_execute_(*(undefined8 *)((long)args + 0x178),&htp_hooks,buf);
    bVar2 = *args;
    if (((*(byte *)(*(long *)((long)args + 0x178) + 0x17) & 0x7f) != 0) || ((bVar2 & 1) != 0))
    goto LAB_0010b036;
  }
  bVar2 = *args;
LAB_0010b036:
  if ((bVar2 & 1) != 0) {
    iVar1 = *(int *)((long)args + 0x18);
    switch(iVar1) {
    case 400:
      pcVar6 = "400 Bad Request";
      break;
    case 0x191:
      pcVar6 = "401 Unauthorized";
      break;
    case 0x192:
      pcVar6 = "402 Payment Required";
      break;
    case 0x193:
      pcVar6 = "403 Forbidden";
      break;
    case 0x194:
      pcVar6 = "404 Not Found";
      break;
    case 0x195:
      pcVar6 = "405 Method Not Allowed";
      break;
    case 0x196:
      pcVar6 = "406 Not Acceptable";
      break;
    case 0x197:
      pcVar6 = "407 Proxy Authentication Required";
      break;
    case 0x198:
      pcVar6 = "408 Request Timeout";
      break;
    case 0x199:
      pcVar6 = "409 Conflict";
      break;
    case 0x19a:
      pcVar6 = "410 Gone";
      break;
    case 0x19b:
      pcVar6 = "411 Length Required";
      break;
    case 0x19c:
      pcVar6 = "412 Precondition Failed";
      break;
    case 0x19d:
      pcVar6 = "413 Request Entity Too Large";
      break;
    case 0x19e:
      pcVar6 = "414 Request-URI Too Long";
      break;
    case 0x19f:
      pcVar6 = "415 Unsupported Media Type";
      break;
    case 0x1a0:
      pcVar6 = "416 Requested Range Not Satisfiable";
      break;
    case 0x1a1:
      pcVar6 = "417 Expectation Failed";
      break;
    default:
      switch(iVar1) {
      case 300:
        pcVar6 = "300 Multiple Choices";
        break;
      case 0x12d:
        pcVar6 = "301 Moved Permanently";
        break;
      case 0x12e:
        pcVar6 = "302 Found";
        break;
      case 0x12f:
        pcVar6 = "303 See Other";
        break;
      case 0x130:
        pcVar6 = "304 Not Modified";
        break;
      case 0x131:
        pcVar6 = "305 Use Proxy";
        break;
      case 0x132:
        pcVar6 = "306 (Unused)";
        break;
      case 0x133:
        pcVar6 = "307 Temporary Redirect";
        break;
      default:
        switch(iVar1) {
        case 200:
          pcVar6 = "200 OK";
          break;
        case 0xc9:
          pcVar6 = "201 Created";
          break;
        case 0xca:
          pcVar6 = "202 Accepted";
          break;
        case 0xcb:
          pcVar6 = "203 Non-Authoritative Information";
          break;
        case 0xcc:
          pcVar6 = "204 No Content";
          break;
        case 0xcd:
          pcVar6 = "205 Reset Content";
          break;
        case 0xce:
          pcVar6 = "206 Partial Content";
          break;
        default:
          switch(iVar1) {
          case 500:
            pcVar6 = "500 Internal Server Error";
            break;
          case 0x1f5:
            pcVar6 = "501 Not Implemented";
            break;
          case 0x1f6:
            pcVar6 = "502 Bad Gateway";
            break;
          case 0x1f7:
            pcVar6 = "503 Service Unavailable";
            break;
          case 0x1f8:
            pcVar6 = "504 Gateway Timeout";
            break;
          case 0x1f9:
            pcVar6 = "505 HTTP Version Not Supported";
            break;
          default:
            if (iVar1 == 100) {
              pcVar6 = "100 Continue";
            }
            else if (iVar1 == 0x65) {
              pcVar6 = "101 Switching Protocols";
            }
            else {
              pcVar6 = "";
            }
          }
        }
      }
    }
    snprintf(write_buf,0x1000,"HTTP/1.1 %s\r\n",pcVar6);
    sVar4 = strlen(write_buf);
    write(__fd,write_buf,sVar4);
    for (p_Var5 = *(_Rb_tree_node_base **)((long)args + 0x118);
        p_Var5 != (_Rb_tree_node_base *)((long)args + 0x108);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      snprintf(write_buf,0x1000,"%s: %s\r\n",*(undefined8 *)(p_Var5 + 1),*(undefined8 *)(p_Var5 + 2)
              );
      sVar4 = strlen(write_buf);
      write(__fd,write_buf,sVar4);
    }
    write(__fd,"\r\n",2);
    if (*(size_t *)((long)args + 0x68) != 0) {
      write(__fd,*(void **)((long)args + 0x60),*(size_t *)((long)args + 0x68));
    }
  }
  close(*(int *)((long)args + 0x10));
  close(__fd);
  return (void *)0x0;
}

Assistant:

void * ResponseHandleRun(void* args) {
  HttpTestListener* client = (HttpTestListener*)args;
  char buf[4096] = {};
  HttpTestListener* handler = (HttpTestListener*)args;
  int fd_client = 0;
  socklen_t len_client = sizeof(sockaddr_in);  
  sockaddr_in addr_client = {};
  fd_client = accept(handler->fd_, (sockaddr*)&addr_client, &len_client);
  http_parser_init_(handler->parser_, HTTP_REQUEST);
  handler->parser_->data = client;
  for(;;) {
    int len = recv(fd_client, buf, sizeof(buf), 0);
    if(len <= 0) {
      break;
    }
    http_parser_execute_(client->parser_, &htp_hooks, buf, len);

    if(handler->parser_->http_errno != 0 || handler->is_request_complete_) {
      break;
    }
  }

  if(handler->is_request_complete_) {
    char write_buf[4096];
    snprintf(write_buf, sizeof(write_buf), "HTTP/1.1 %s\r\n", get_status_string(handler->response_status_code_, 0));
    write(fd_client, write_buf, strlen(write_buf));
    for(std::map<std::string, std::string>::iterator it = handler->map_response_header_.begin();
        it !=  handler->map_response_header_.end(); it++) {
      snprintf(write_buf, sizeof(write_buf), "%s: %s\r\n", it->first.c_str(), it->second.c_str());
      write(fd_client, write_buf, strlen(write_buf));
    }
    write(fd_client, "\r\n", 2);

    if(client->response_body_.size() > 0) {
      write(fd_client, client->response_body_.c_str(), client->response_body_.size());
    }

  }
out:
  close(handler->fd_);
  close(fd_client);
  return NULL;
}